

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BailOut.cpp
# Opt level: O0

void BailOutRecord::ScheduleLoopBodyCodeGen
               (ScriptFunction *function,ScriptFunction *innerMostInlinee,
               BailOutRecord *bailOutRecord,BailOutKind bailOutKind)

{
  ushort uVar1;
  code *pcVar2;
  char cVar3;
  BailOutRecord *bailoutRecord;
  LoopHeader *pLVar4;
  bool bVar5;
  byte bVar6;
  uint8 uVar7;
  uint uVar8;
  LocalFunctionId LVar9;
  BailOutKind BVar10;
  BailOutKind BVar11;
  uint uVar12;
  int iVar13;
  undefined4 *puVar14;
  ScriptContext *pSVar15;
  ThreadContext *this;
  DynamicProfileInfo *this_00;
  FunctionBody *pFVar16;
  undefined4 extraout_var;
  char *pcVar17;
  undefined8 uVar18;
  char16 *pcVar19;
  char *pcVar20;
  RejitReason local_11d;
  uint local_dc;
  wchar local_c8 [4];
  char16 debugStringBuffer [42];
  DynamicProfileInfo *profileInfo;
  LoopEntryPointInfo *pLStack_58;
  uint8 totalJittedLoopIterations;
  LoopEntryPointInfo *entryPointInfo;
  BailOutRecord *pBStack_48;
  RejitReason rejitReason;
  BailOutRecord *bailOutRecordNotConst;
  InterpreterStackFrame *interpreterFrame;
  LoopHeader *loopHeader;
  FunctionBody *executeFunction;
  BailOutRecord *pBStack_20;
  BailOutKind bailOutKind_local;
  BailOutRecord *bailOutRecord_local;
  ScriptFunction *innerMostInlinee_local;
  ScriptFunction *function_local;
  
  executeFunction._4_4_ = bailOutKind;
  pBStack_20 = bailOutRecord;
  bailOutRecord_local = (BailOutRecord *)innerMostInlinee;
  innerMostInlinee_local = function;
  if (bailOutKind == LazyBailOut) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar14 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                       ,0x996,"(bailOutKind != IR::LazyBailOut)","bailOutKind != IR::LazyBailOut");
    if (!bVar5) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar14 = 0;
  }
  loopHeader = (LoopHeader *)
               Js::JavascriptFunction::GetFunctionBody((JavascriptFunction *)innerMostInlinee_local)
  ;
  uVar8 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)loopHeader);
  LVar9 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)loopHeader);
  bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,ReJITPhase,uVar8,LVar9);
  if (bVar5) {
    return;
  }
  interpreterFrame = (InterpreterStackFrame *)0x0;
  pSVar15 = Js::FunctionProxy::GetScriptContext((FunctionProxy *)loopHeader);
  this = Js::ScriptContext::GetThreadContext(pSVar15);
  bailOutRecordNotConst = (BailOutRecord *)ThreadContext::GetLeafInterpreterFrame(this);
  pLVar4 = loopHeader;
  uVar8 = Js::InterpreterStackFrame::GetCurrentLoopNum
                    ((InterpreterStackFrame *)bailOutRecordNotConst);
  interpreterFrame =
       (InterpreterStackFrame *)Js::FunctionBody::GetLoopHeader((FunctionBody *)pLVar4,uVar8);
  if ((LoopHeader *)interpreterFrame == (LoopHeader *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar14 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                       ,0x9a4,"(loopHeader != nullptr)","loopHeader != nullptr");
    if (!bVar5) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar14 = 0;
  }
  pBStack_48 = pBStack_20;
  pBStack_20->bailOutCount = pBStack_20->bailOutCount + 1;
  entryPointInfo._7_1_ = None;
  if (executeFunction._4_4_ == BailOutInvalid) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar14 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                       ,0x9aa,"(bailOutKind != IR::BailOutInvalid)",
                       "bailOutKind != IR::BailOutInvalid");
    if (!bVar5) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar14 = 0;
  }
  pLStack_58 = Js::LoopHeader::GetCurrentEntryPointInfo((LoopHeader *)interpreterFrame);
  pLStack_58->totalJittedLoopIterations =
       pLStack_58->jittedLoopIterationsSinceLastBailout + pLStack_58->totalJittedLoopIterations;
  pLStack_58->jittedLoopIterationsSinceLastBailout = 0;
  if (pLStack_58->totalJittedLoopIterations < 0x100) {
    local_dc = pLStack_58->totalJittedLoopIterations & 0xff;
  }
  else {
    local_dc = 0xff;
  }
  profileInfo._7_1_ = (byte)local_dc;
  bVar6 = Js::LoopEntryPointInfo::GetDecrLoopCountPerBailout();
  cVar3 = profileInfo._7_1_;
  if (bVar6 < local_dc) {
    uVar7 = Js::LoopEntryPointInfo::GetDecrLoopCountPerBailout();
    profileInfo._7_1_ = cVar3 - uVar7;
  }
  else {
    profileInfo._7_1_ = 0;
  }
  BVar11 = executeFunction._4_4_;
  pLVar4 = loopHeader;
  bailoutRecord = pBStack_48;
  uVar8 = Js::InterpreterStackFrame::GetCurrentLoopNum
                    ((InterpreterStackFrame *)bailOutRecordNotConst);
  CheckPreemptiveRejit
            ((FunctionBody *)pLVar4,BVar11,bailoutRecord,(uint8 *)((long)&profileInfo + 7),uVar8);
  pLStack_58->totalJittedLoopIterations = (uint)profileInfo._7_1_;
  bVar5 = Js::FunctionBody::HasDynamicProfileInfo((FunctionBody *)loopHeader);
  if ((!bVar5) || (profileInfo._7_1_ != 0)) {
    uVar8 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)loopHeader);
    LVar9 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)loopHeader);
    bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_01ea41a0,ReJITPhase,uVar8,LVar9);
    if (!bVar5) goto LAB_005094a4;
  }
  this_00 = Js::FunctionBody::GetAnyDynamicProfileInfo((FunctionBody *)loopHeader);
  BVar11 = executeFunction._4_4_;
  BVar10 = IR::operator|(BailOutOnResultConditions,BailOutOnDivSrcConditions);
  BVar11 = IR::operator&(BVar11,BVar10);
  if (((BVar11 == BailOutInvalid) && (executeFunction._4_4_ != BailOutIntOnly)) &&
     (executeFunction._4_4_ != BailOnIntMin)) {
    if (executeFunction._4_4_ - BailOutNumberOnly < 2) {
      Js::DynamicProfileInfo::DisableFloatTypeSpec(this_00);
      Js::FunctionBody::SetDontRethunkAfterBailout((FunctionBody *)loopHeader);
      entryPointInfo._7_1_ = FloatTypeSpecDisabled;
    }
    else if (executeFunction._4_4_ - BailOutOnImplicitCalls < 2) {
      entryPointInfo._7_1_ = ImplicitCallFlagsChanged;
    }
    else if (executeFunction._4_4_ == BailOutOnNotPrimitive) {
      Js::DynamicProfileInfo::DisableLossyIntTypeSpec(this_00);
      Js::FunctionBody::SetDontRethunkAfterBailout((FunctionBody *)loopHeader);
      entryPointInfo._7_1_ = LossyIntTypeSpecDisabled;
    }
    else if (executeFunction._4_4_ == BailOutOnMemOpError) {
      Js::DynamicProfileInfo::DisableMemOp(this_00);
      Js::FunctionBody::SetDontRethunkAfterBailout((FunctionBody *)loopHeader);
      entryPointInfo._7_1_ = MemOpDisabled;
    }
    else if (executeFunction._4_4_ == BailOutOnInlineFunction) {
LAB_0050930e:
      entryPointInfo._7_1_ = InlineeChanged;
    }
    else if (executeFunction._4_4_ == BailOutOnNoProfile) {
      entryPointInfo._7_1_ = NoProfile;
      Js::FunctionBody::ResetBailOnMisingProfileCount((FunctionBody *)loopHeader);
    }
    else {
      if (executeFunction._4_4_ - BailOutOnPolymorphicInlineFunction < 2) goto LAB_0050930e;
      if (executeFunction._4_4_ == BailOutOnNotArray) {
        Js::DynamicProfileInfo::DisableArrayCheckHoist(this_00,true);
        Js::FunctionBody::SetDontRethunkAfterBailout((FunctionBody *)loopHeader);
        entryPointInfo._7_1_ = ArrayCheckHoistDisabled;
      }
      else if (executeFunction._4_4_ == BailOutOnNotNativeArray) {
        uVar8 = Js::LoopHeader::GetRejitCount((LoopHeader *)interpreterFrame);
        if (uVar8 < 0x32) {
          entryPointInfo._7_1_ = ExpectingNativeArray;
        }
        else {
          entryPointInfo._7_1_ = None;
        }
      }
      else if (executeFunction._4_4_ == BailOutConventionalTypedArrayAccessOnly) {
        Js::DynamicProfileInfo::DisableTypedArrayTypeSpec(this_00,true);
        Js::FunctionBody::SetDontRethunkAfterBailout((FunctionBody *)loopHeader);
        entryPointInfo._7_1_ = TypedArrayTypeSpecDisabled;
      }
      else if (executeFunction._4_4_ == BailOutOnIrregularLength) {
        Js::DynamicProfileInfo::DisableLdLenIntSpec(this_00);
        Js::FunctionBody::SetDontRethunkAfterBailout((FunctionBody *)loopHeader);
        entryPointInfo._7_1_ = LdLenIntSpecDisabled;
      }
      else if (executeFunction._4_4_ == BailOutCheckThis) {
        Js::DynamicProfileInfo::DisableCheckThis(this_00);
        Js::FunctionBody::SetDontRethunkAfterBailout((FunctionBody *)loopHeader);
        entryPointInfo._7_1_ = CheckThisDisabled;
      }
      else if (executeFunction._4_4_ == BailOutOnTaggedValue) {
        Js::DynamicProfileInfo::DisableTagCheck(this_00);
        Js::FunctionBody::SetDontRethunkAfterBailout((FunctionBody *)loopHeader);
        entryPointInfo._7_1_ = FailedTagCheck;
      }
      else if (executeFunction._4_4_ == BailOutFailedTypeCheck) {
        uVar8 = Js::FunctionBody::GetByteCodeInLoopCount((FunctionBody *)loopHeader);
        if (DAT_01eafd10 < uVar8) {
          Js::DynamicProfileInfo::DisableObjTypeSpecInJitLoopBody(this_00);
          bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,DisabledObjTypeSpecPhase);
          if (bVar5) {
            uVar8 = Js::FunctionBody::GetLoopNumber
                              ((FunctionBody *)loopHeader,(LoopHeader *)interpreterFrame);
            uVar18 = (*(code *)(loopHeader->entryPoints).ptr[1].
                               super_List<Js::LoopEntryPointInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                               .
                               super_ReadOnlyList<Js::LoopEntryPointInfo_*,_Memory::Recycler,_DefaultComparer>
                               ._vptr_ReadOnlyList)();
            uVar12 = Js::FunctionProxy::GetFunctionNumber((FunctionProxy *)loopHeader);
            Output::Print(L"Disabled obj type spec in jit loop body for loop %d in %s (%d)\n",
                          (ulong)uVar8,uVar18,(ulong)uVar12);
            Output::Flush();
          }
        }
        entryPointInfo._7_1_ = FailedTypeCheck;
      }
      else if (executeFunction._4_4_ == BailOutFailedEquivalentTypeCheck) {
LAB_005093e0:
        local_11d = FailedEquivalentTypeCheck;
        if (executeFunction._4_4_ != BailOutFailedEquivalentTypeCheck) {
          local_11d = FailedEquivalentFixedFieldTypeCheck;
        }
        entryPointInfo._7_1_ = local_11d;
      }
      else if (executeFunction._4_4_ == BailOutExpectingInteger) {
        Js::DynamicProfileInfo::DisableSwitchOpt(this_00);
        Js::FunctionBody::SetDontRethunkAfterBailout((FunctionBody *)loopHeader);
        entryPointInfo._7_1_ = DisableSwitchOptExpectingInteger;
      }
      else if (executeFunction._4_4_ == BailOutExpectingString) {
        Js::DynamicProfileInfo::DisableSwitchOpt(this_00);
        Js::FunctionBody::SetDontRethunkAfterBailout((FunctionBody *)loopHeader);
        entryPointInfo._7_1_ = DisableSwitchOptExpectingString;
      }
      else if (executeFunction._4_4_ == BailOutFailedFixedFieldTypeCheck) {
        entryPointInfo._7_1_ = FailedFixedFieldTypeCheck;
      }
      else if (executeFunction._4_4_ == BailOutFailedFixedFieldCheck) {
        entryPointInfo._7_1_ = FailedFixedFieldCheck;
      }
      else {
        if (executeFunction._4_4_ == BailOutFailedEquivalentFixedFieldTypeCheck) goto LAB_005093e0;
        if (executeFunction._4_4_ == BailOutOnFloor) {
          Js::DynamicProfileInfo::DisableFloorInlining(this_00);
          entryPointInfo._7_1_ = FloorInliningDisabled;
        }
        else if (executeFunction._4_4_ == BailOnModByPowerOf2) {
          entryPointInfo._7_1_ = ModByPowerOf2;
        }
        else if (executeFunction._4_4_ == BailOutFailedCtorGuardCheck) {
          entryPointInfo._7_1_ = CtorGuardInvalidated;
        }
        else if (executeFunction._4_4_ == BailOutOnFailedHoistedBoundCheck) {
          Js::DynamicProfileInfo::DisableBoundCheckHoist(this_00,true);
          Js::FunctionBody::SetDontRethunkAfterBailout((FunctionBody *)loopHeader);
          entryPointInfo._7_1_ = BoundCheckHoistDisabled;
        }
        else if (executeFunction._4_4_ == BailOutOnFailedHoistedLoopCountBasedBoundCheck) {
          Js::DynamicProfileInfo::DisableLoopCountBasedBoundCheckHoist(this_00,true);
          Js::FunctionBody::SetDontRethunkAfterBailout((FunctionBody *)loopHeader);
          entryPointInfo._7_1_ = LoopCountBasedBoundCheckHoistDisabled;
        }
        else if (executeFunction._4_4_ == BailOutOnPowIntIntOverflow) {
          Js::DynamicProfileInfo::DisablePowIntIntTypeSpec(this_00);
          Js::FunctionBody::SetDontRethunkAfterBailout((FunctionBody *)loopHeader);
          entryPointInfo._7_1_ = PowIntIntTypeSpecDisabled;
        }
        else if (executeFunction._4_4_ == BailOutOnMissingValue) {
          Js::DynamicProfileInfo::DisableArrayMissingValueCheckHoist(this_00,true);
          entryPointInfo._7_1_ = ArrayMissingValueCheckHoistDisabled;
        }
        else if (executeFunction._4_4_ == BailOutConventionalNativeArrayAccessOnly) {
          entryPointInfo._7_1_ = ExpectingConventionalNativeArrayAccess;
        }
        else if (executeFunction._4_4_ == BailOutConvertedNativeArray) {
          entryPointInfo._7_1_ = ConvertedNativeArray;
        }
        else if (executeFunction._4_4_ == BailOutOnArrayAccessHelperCall) {
          entryPointInfo._7_1_ = ArrayAccessNeededHelperCall;
        }
        else if (executeFunction._4_4_ == BailOutOnInvalidatedArrayHeadSegment) {
          Js::DynamicProfileInfo::DisableJsArraySegmentHoist(this_00,true);
          Js::FunctionBody::SetDontRethunkAfterBailout((FunctionBody *)loopHeader);
          entryPointInfo._7_1_ = JsArraySegmentHoistDisabled;
        }
        else if (executeFunction._4_4_ == BailOnStackArgsOutOfActualsRange) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar14 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar14 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                             ,0x9f6,"(false)",
                             "How did we reach here ? Stack args opt is currently disabled in loop body gen."
                            );
          if (!bVar5) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar14 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar14 = 0;
        }
      }
    }
  }
  else {
    BVar10 = IR::operator&(executeFunction._4_4_,BailOutOnMulOverflow);
    BVar11 = executeFunction._4_4_;
    if (BVar10 == BailOutInvalid) {
      BVar10 = IR::operator|(BailOutOnDivByZero,BailOutOnDivOfMinInt);
      BVar11 = IR::operator&(BVar11,BVar10);
      if ((BVar11 == BailOutInvalid) && (executeFunction._4_4_ != BailOnDivResultNotInt)) {
        Js::DynamicProfileInfo::DisableAggressiveIntTypeSpec(this_00,true);
        entryPointInfo._7_1_ = AggressiveIntTypeSpecDisabled;
      }
      else {
        Js::DynamicProfileInfo::DisableDivIntTypeSpec(this_00,true);
        entryPointInfo._7_1_ = DivIntTypeSpecDisabled;
      }
    }
    else {
      Js::DynamicProfileInfo::DisableAggressiveMulIntTypeSpec(this_00,true);
      entryPointInfo._7_1_ = AggressiveMulIntTypeSpecDisabled;
    }
    Js::FunctionBody::SetDontRethunkAfterBailout((FunctionBody *)loopHeader);
  }
  uVar8 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)loopHeader);
  LVar9 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)loopHeader);
  bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_01ea41a0,ReJITPhase,uVar8,LVar9);
  if ((bVar5) && (entryPointInfo._7_1_ == None)) {
    entryPointInfo._7_1_ = Forced;
  }
LAB_005094a4:
  uVar8 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)loopHeader);
  LVar9 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)loopHeader);
  bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_01ea41a0,ReJITPhase,uVar8,LVar9);
  if ((bVar5) && (entryPointInfo._7_1_ == None)) {
    entryPointInfo._7_1_ = Forced;
  }
  bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_01ec73f0,ReJITPhase);
  if ((bVar5) &&
     ((bVar5 = Js::NumberSet::Empty((NumberSet *)&DAT_01eca300), bVar5 ||
      (bVar5 = Js::NumberSet::Contains((NumberSet *)&DAT_01eca300,executeFunction._4_4_), bVar5))))
  {
    pFVar16 = Js::JavascriptFunction::GetFunctionBody((JavascriptFunction *)innerMostInlinee_local);
    iVar13 = (*(pFVar16->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
               super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])();
    uVar8 = Js::FunctionBody::GetLoopNumber
                      ((FunctionBody *)loopHeader,(LoopHeader *)interpreterFrame);
    pcVar20 = GetBailOutKindName(executeFunction._4_4_);
    pcVar17 = GetRejitReasonName(entryPointInfo._7_1_);
    Output::Print(L"Bailout from loop: function: %s, loopNumber: %d, bailOutKindName: (%S), reJitReason: %S\r\n"
                  ,CONCAT44(extraout_var,iVar13),(ulong)uVar8,pcVar20,pcVar17);
    Output::Flush();
  }
  pSVar15 = Js::FunctionProxy::GetScriptContext((FunctionProxy *)loopHeader);
  Js::ScriptContext::LogBailout(pSVar15,(FunctionBody *)loopHeader,executeFunction._4_4_);
  if (entryPointInfo._7_1_ != None) {
    pSVar15 = Js::FunctionProxy::GetScriptContext((FunctionProxy *)loopHeader);
    Js::ScriptContext::LogRejit(pSVar15,(FunctionBody *)loopHeader,entryPointInfo._7_1_);
    uVar8 = Js::FunctionBody::GetLoopInterpretCount
                      ((FunctionBody *)loopHeader,(LoopHeader *)interpreterFrame);
    *(uint *)(interpreterFrame + 0x10) = uVar8 - 2;
    Js::LoopHeader::CreateEntryPoint((LoopHeader *)interpreterFrame);
    Js::LoopHeader::IncRejitCount((LoopHeader *)interpreterFrame);
    uVar8 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)loopHeader);
    LVar9 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)loopHeader);
    bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,ReJITPhase,uVar8,LVar9);
    if (bVar5) {
      uVar18 = (*(code *)(loopHeader->entryPoints).ptr[1].
                         super_List<Js::LoopEntryPointInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                         .
                         super_ReadOnlyList<Js::LoopEntryPointInfo_*,_Memory::Recycler,_DefaultComparer>
                         ._vptr_ReadOnlyList)();
      pcVar19 = Js::FunctionProxy::GetDebugNumberSet
                          ((FunctionProxy *)loopHeader,(wchar (*) [42])local_c8);
      uVar8 = Js::FunctionBody::GetLoopNumber
                        ((FunctionBody *)loopHeader,(LoopHeader *)interpreterFrame);
      uVar1 = pBStack_20->bailOutCount;
      pcVar20 = GetRejitReasonName(entryPointInfo._7_1_);
      Output::Print(L"Rejit(loop): function: %s (%s) loop: %u bailOutCount: %hu reason: %S",uVar18,
                    pcVar19,(ulong)uVar8,(ulong)uVar1,pcVar20);
      if (executeFunction._4_4_ != BailOutInvalid) {
        pcVar20 = GetBailOutKindName(executeFunction._4_4_);
        Output::Print(L" (%S)",pcVar20);
      }
      Output::Print(L"\n");
      Output::Flush();
    }
  }
  return;
}

Assistant:

void BailOutRecord::ScheduleLoopBodyCodeGen(Js::ScriptFunction * function, Js::ScriptFunction * innerMostInlinee, BailOutRecord const * bailOutRecord, IR::BailOutKind bailOutKind)
{
    Assert(bailOutKind != IR::LazyBailOut);
    Js::FunctionBody * executeFunction = function->GetFunctionBody();

    if (PHASE_OFF(Js::ReJITPhase, executeFunction))
    {
        return;
    }

    Js::LoopHeader * loopHeader = nullptr;

    Js::InterpreterStackFrame * interpreterFrame = executeFunction->GetScriptContext()->GetThreadContext()->GetLeafInterpreterFrame();

    loopHeader = executeFunction->GetLoopHeader(interpreterFrame->GetCurrentLoopNum());

    Assert(loopHeader != nullptr);

    BailOutRecord * bailOutRecordNotConst = (BailOutRecord *)(void *)bailOutRecord;
    bailOutRecordNotConst->bailOutCount++;

    RejitReason rejitReason = RejitReason::None;
    Assert(bailOutKind != IR::BailOutInvalid);

    Js::LoopEntryPointInfo* entryPointInfo = loopHeader->GetCurrentEntryPointInfo();

    entryPointInfo->totalJittedLoopIterations += entryPointInfo->jittedLoopIterationsSinceLastBailout;
    entryPointInfo->jittedLoopIterationsSinceLastBailout = 0;
    uint8 totalJittedLoopIterations = entryPointInfo->totalJittedLoopIterations > 255 ? 255 : static_cast<uint8>(entryPointInfo->totalJittedLoopIterations);
    totalJittedLoopIterations = totalJittedLoopIterations <= Js::LoopEntryPointInfo::GetDecrLoopCountPerBailout() ? 0 : totalJittedLoopIterations - Js::LoopEntryPointInfo::GetDecrLoopCountPerBailout();

    CheckPreemptiveRejit(executeFunction, bailOutKind, bailOutRecordNotConst, totalJittedLoopIterations, interpreterFrame->GetCurrentLoopNum());

    entryPointInfo->totalJittedLoopIterations = totalJittedLoopIterations;

    if ((executeFunction->HasDynamicProfileInfo() && totalJittedLoopIterations == 0) ||
        PHASE_FORCE(Js::ReJITPhase, executeFunction))
    {
        Js::DynamicProfileInfo * profileInfo = executeFunction->GetAnyDynamicProfileInfo();

        if ((bailOutKind & (IR::BailOutOnResultConditions | IR::BailOutOnDivSrcConditions)) || bailOutKind == IR::BailOutIntOnly || bailOutKind == IR::BailOnIntMin)
        {
            if (bailOutKind & IR::BailOutOnMulOverflow)
            {
                profileInfo->DisableAggressiveMulIntTypeSpec(true);
                rejitReason = RejitReason::AggressiveMulIntTypeSpecDisabled;
            }
            else if ((bailOutKind & (IR::BailOutOnDivByZero | IR::BailOutOnDivOfMinInt)) || bailOutKind == IR::BailOnDivResultNotInt)
            {
                profileInfo->DisableDivIntTypeSpec(true);
                rejitReason = RejitReason::DivIntTypeSpecDisabled;
            }
            else
            {
                profileInfo->DisableAggressiveIntTypeSpec(true);
                rejitReason = RejitReason::AggressiveIntTypeSpecDisabled;
            }
            executeFunction->SetDontRethunkAfterBailout();
        }
        else switch(bailOutKind)
        {
            case IR::BailOutOnNotPrimitive:
                profileInfo->DisableLossyIntTypeSpec();
                executeFunction->SetDontRethunkAfterBailout();
                rejitReason = RejitReason::LossyIntTypeSpecDisabled;
                break;

            case IR::BailOutOnMemOpError:
                profileInfo->DisableMemOp();
                executeFunction->SetDontRethunkAfterBailout();
                rejitReason = RejitReason::MemOpDisabled;
                break;

            case IR::BailOutPrimitiveButString:
            case IR::BailOutNumberOnly:
                profileInfo->DisableFloatTypeSpec();
                executeFunction->SetDontRethunkAfterBailout();
                rejitReason = RejitReason::FloatTypeSpecDisabled;
                break;

            case IR::BailOutOnImplicitCalls:
            case IR::BailOutOnImplicitCallsPreOp:
                rejitReason = RejitReason::ImplicitCallFlagsChanged;
                break;

            case IR::BailOutExpectingInteger:
                profileInfo->DisableSwitchOpt();
                executeFunction->SetDontRethunkAfterBailout();
                rejitReason = RejitReason::DisableSwitchOptExpectingInteger;
                break;

            case IR::BailOutExpectingString:
                profileInfo->DisableSwitchOpt();
                executeFunction->SetDontRethunkAfterBailout();
                rejitReason = RejitReason::DisableSwitchOptExpectingString;
                break;

            case IR::BailOnStackArgsOutOfActualsRange:
                AssertMsg(false, "How did we reach here ? Stack args opt is currently disabled in loop body gen.");
                break;

            case IR::BailOnModByPowerOf2:
                rejitReason = RejitReason::ModByPowerOf2;
                break;

            case IR::BailOutOnNotArray:
                profileInfo->DisableArrayCheckHoist(true);
                executeFunction->SetDontRethunkAfterBailout();
                rejitReason = RejitReason::ArrayCheckHoistDisabled;
                break;

            case IR::BailOutOnNotNativeArray:
                // REVIEW: We have an issue with array profile info.  The info on the type of array we have won't
                //         get fixed by rejitting.  For now, just give up after 50 rejits.
                if (loopHeader->GetRejitCount() >= 50)
                {
                    rejitReason = RejitReason::None;
                }
                else
                {
                    rejitReason = RejitReason::ExpectingNativeArray;
                }
                break;

            case IR::BailOutConvertedNativeArray:
                rejitReason = RejitReason::ConvertedNativeArray;
                break;

            case IR::BailOutConventionalTypedArrayAccessOnly:
                profileInfo->DisableTypedArrayTypeSpec(true);
                executeFunction->SetDontRethunkAfterBailout();
                rejitReason = RejitReason::TypedArrayTypeSpecDisabled;
                break;

            case IR::BailOutConventionalNativeArrayAccessOnly:
                rejitReason = RejitReason::ExpectingConventionalNativeArrayAccess;
                break;

            case IR::BailOutOnMissingValue:
                profileInfo->DisableArrayMissingValueCheckHoist(true);
                rejitReason = RejitReason::ArrayMissingValueCheckHoistDisabled;
                break;

            case IR::BailOutOnArrayAccessHelperCall:
                // This is a pre-op bailout, so the interpreter will update the profile data for this byte-code instruction to
                // prevent excessive bailouts here in the future
                rejitReason = RejitReason::ArrayAccessNeededHelperCall;
                break;

            case IR::BailOutOnInvalidatedArrayHeadSegment:
                profileInfo->DisableJsArraySegmentHoist(true);
                executeFunction->SetDontRethunkAfterBailout();
                rejitReason = RejitReason::JsArraySegmentHoistDisabled;
                break;

            case IR::BailOutOnIrregularLength:
                profileInfo->DisableLdLenIntSpec();
                executeFunction->SetDontRethunkAfterBailout();
                rejitReason = RejitReason::LdLenIntSpecDisabled;
                break;

            case IR::BailOutOnFailedHoistedBoundCheck:
                profileInfo->DisableBoundCheckHoist(true);
                executeFunction->SetDontRethunkAfterBailout();
                rejitReason = RejitReason::BoundCheckHoistDisabled;
                break;

            case IR::BailOutOnFailedHoistedLoopCountBasedBoundCheck:
                profileInfo->DisableLoopCountBasedBoundCheckHoist(true);
                executeFunction->SetDontRethunkAfterBailout();
                rejitReason = RejitReason::LoopCountBasedBoundCheckHoistDisabled;
                break;

            case IR::BailOutOnInlineFunction:
            case IR::BailOutOnPolymorphicInlineFunction:
            case IR::BailOutOnFailedPolymorphicInlineTypeCheck:
                rejitReason = RejitReason::InlineeChanged;
                break;

            case IR::BailOutOnNoProfile:
                rejitReason = RejitReason::NoProfile;
                executeFunction->ResetBailOnMisingProfileCount();
                break;

            case IR::BailOutCheckThis:
                profileInfo->DisableCheckThis();
                executeFunction->SetDontRethunkAfterBailout();
                rejitReason = RejitReason::CheckThisDisabled;
                break;

            case IR::BailOutFailedTypeCheck:
                // An inline cache must have gone from monomorphic to polymorphic.
                // This is already noted in the profile data, so optimization of the given ld/st will
                // be inhibited on re-jit.
                // Consider disabling the optimization across the function after n failed type checks.

                // Disable ObjTypeSpec in a large loop body after the first rejit itself.
                // Rejitting a large loop body takes more time and the fact that loop bodies are prioritized ahead of functions to be jitted only augments the problem.
                if(executeFunction->GetByteCodeInLoopCount() > (uint)CONFIG_FLAG(LoopBodySizeThresholdToDisableOpts))
                {
                    profileInfo->DisableObjTypeSpecInJitLoopBody();
                    if(PHASE_TRACE1(Js::DisabledObjTypeSpecPhase))
                    {
                        Output::Print(_u("Disabled obj type spec in jit loop body for loop %d in %s (%d)\n"),
                            executeFunction->GetLoopNumber(loopHeader), executeFunction->GetDisplayName(), executeFunction->GetFunctionNumber());
                        Output::Flush();
                    }
                }

                rejitReason = RejitReason::FailedTypeCheck;
                break;

            case IR::BailOutFailedFixedFieldTypeCheck:
                // An inline cache must have gone from monomorphic to polymorphic or some fixed field
                // became non-fixed.  Either one is already noted in the profile data and type system,
                // so optimization of the given instruction will be inhibited on re-jit.
                // Consider disabling the optimization across the function after n failed type checks.
                rejitReason = RejitReason::FailedFixedFieldTypeCheck;
                break;

            case IR::BailOutFailedEquivalentTypeCheck:
            case IR::BailOutFailedEquivalentFixedFieldTypeCheck:
                rejitReason = bailOutKind == IR::BailOutFailedEquivalentTypeCheck ?
                    RejitReason::FailedEquivalentTypeCheck : RejitReason::FailedEquivalentFixedFieldTypeCheck;
                break;

            case IR::BailOutFailedCtorGuardCheck:
                // (ObjTypeSpec): Consider scheduling re-JIT right after the first bailout.  We will never successfully execute the
                // function from which we just bailed out, unless we take a different code path through it.

                // A constructor cache guard may be invalidated for one of two reasons:
                // a) the constructor's prototype property has changed, or
                // b) one of the properties protected by the guard (this constructor cache served as) has changed in some way (e.g. became
                // read-only).
                // In the former case, the cache itself will be marked as polymorphic and on re-JIT we won't do the optimization.
                // In the latter case, the inline cache for the offending property will be cleared and on re-JIT the guard will not be enlisted
                // to protect that property operation.
                rejitReason = RejitReason::CtorGuardInvalidated;
                break;

            case IR::BailOutOnFloor:
            {
                profileInfo->DisableFloorInlining();
                rejitReason = RejitReason::FloorInliningDisabled;
                break;
            }

            case IR::BailOutFailedFixedFieldCheck:
                rejitReason = RejitReason::FailedFixedFieldCheck;
                break;

            case IR::BailOutOnTaggedValue:
                profileInfo->DisableTagCheck();
                executeFunction->SetDontRethunkAfterBailout();
                rejitReason = RejitReason::FailedTagCheck;
                break;

            case IR::BailOutOnPowIntIntOverflow:
                profileInfo->DisablePowIntIntTypeSpec();
                executeFunction->SetDontRethunkAfterBailout();
                rejitReason = RejitReason::PowIntIntTypeSpecDisabled;
                break;
        }

        if(PHASE_FORCE(Js::ReJITPhase, executeFunction) && rejitReason == RejitReason::None)
        {
            rejitReason = RejitReason::Forced;
        }
    }

    if (PHASE_FORCE(Js::ReJITPhase, executeFunction) && rejitReason == RejitReason::None)
    {
        rejitReason = RejitReason::Forced;
    }

    REJIT_KIND_TESTTRACE(bailOutKind, _u("Bailout from loop: function: %s, loopNumber: %d, bailOutKindName: (%S), reJitReason: %S\r\n"),
        function->GetFunctionBody()->GetDisplayName(), executeFunction->GetLoopNumber(loopHeader),
        ::GetBailOutKindName(bailOutKind), GetRejitReasonName(rejitReason));

    JS_ETW(EventWriteJSCRIPT_BACKEND_BAILOUT_FROM_LOOP_BODY(
        function->GetFunctionBody()->GetLocalFunctionId(), function->GetFunctionBody()->GetSourceContextId(),
        function->GetFunctionBody()->GetDisplayName(), executeFunction->GetLoopNumber(loopHeader),
        bailOutKind, GetRejitReasonName(rejitReason)));

#ifdef REJIT_STATS
    executeFunction->GetScriptContext()->LogBailout(executeFunction, bailOutKind);
#endif

    if (rejitReason != RejitReason::None)
    {
#ifdef REJIT_STATS
        executeFunction->GetScriptContext()->LogRejit(executeFunction, rejitReason);
#endif
        // Single bailout triggers re-JIT of loop body. the actual codegen scheduling of the new
        // loop body happens in the interpreter
        loopHeader->interpretCount = executeFunction->GetLoopInterpretCount(loopHeader) - 2;
        loopHeader->CreateEntryPoint();
        loopHeader->IncRejitCount();

#if ENABLE_DEBUG_CONFIG_OPTIONS
        if(PHASE_TRACE(Js::ReJITPhase, executeFunction))
        {
            char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
            Output::Print(
                _u("Rejit(loop): function: %s (%s) loop: %u bailOutCount: %hu reason: %S"),
                executeFunction->GetDisplayName(),
                executeFunction->GetDebugNumberSet(debugStringBuffer),
                executeFunction->GetLoopNumber(loopHeader),
                bailOutRecord->bailOutCount,
                GetRejitReasonName(rejitReason));
            if(bailOutKind != IR::BailOutInvalid)
            {
                Output::Print(_u(" (%S)"), ::GetBailOutKindName(bailOutKind));
            }
            Output::Print(_u("\n"));
            Output::Flush();
        }
#endif
    }
}